

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChContactSurfaceMesh.cpp
# Opt level: O1

void __thiscall
chrono::fea::ChContactTriangleXYZ::ContactableIncrementState
          (ChContactTriangleXYZ *this,ChState *x,ChStateDelta *dw,ChState *x_new)

{
  element_type *peVar1;
  
  peVar1 = (this->mnode1).super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>.
           _M_ptr;
  (*(peVar1->super_ChNodeFEAbase)._vptr_ChNodeFEAbase[0x15])(peVar1,0,x_new,x,0,dw);
  peVar1 = (this->mnode2).super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>.
           _M_ptr;
  (*(peVar1->super_ChNodeFEAbase)._vptr_ChNodeFEAbase[0x15])(peVar1,3,x_new,x,3,dw);
  peVar1 = (this->mnode3).super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>.
           _M_ptr;
  (*(peVar1->super_ChNodeFEAbase)._vptr_ChNodeFEAbase[0x15])(peVar1,6,x_new,x,6,dw);
  return;
}

Assistant:

void ChContactTriangleXYZ::ContactableIncrementState(const ChState& x, const ChStateDelta& dw, ChState& x_new) {
    mnode1->NodeIntStateIncrement(0, x_new, x, 0, dw);
    mnode2->NodeIntStateIncrement(3, x_new, x, 3, dw);
    mnode3->NodeIntStateIncrement(6, x_new, x, 6, dw);
}